

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9_value_is_empty(jx9_value *pVal)

{
  uint uVar1;
  char *pcVar2;
  ulong uVar3;
  char *pcVar4;
  bool bVar5;
  
  uVar1 = pVal->iFlags;
  bVar5 = true;
  if ((uVar1 & 0x20) != 0) goto LAB_0010cf32;
  if ((uVar1 & 2) == 0) {
    if ((uVar1 & 4) != 0) {
      bVar5 = (bool)(-((pVal->x).rVal == 0.0) & 1);
      goto LAB_0010cf32;
    }
    if ((uVar1 & 8) == 0) {
      if ((uVar1 & 1) == 0) {
        if ((uVar1 & 0x40) != 0) {
          bVar5 = *(int *)((pVal->x).iVal + 0x2c) == 0;
          goto LAB_0010cf32;
        }
        bVar5 = (uVar1 >> 8 & 1) != 0;
      }
      else {
        uVar3 = (ulong)(pVal->sBlob).nByte;
        if (uVar3 == 0) goto LAB_0010cf32;
        pcVar2 = (char *)(pVal->sBlob).pBlob;
        pcVar4 = pcVar2 + uVar3;
        do {
          if (*pcVar2 != '0') break;
          pcVar2 = pcVar2 + 1;
        } while (pcVar2 < pcVar4);
        bVar5 = pcVar2 < pcVar4;
      }
      bVar5 = !bVar5;
      goto LAB_0010cf32;
    }
  }
  bVar5 = (pVal->x).iVal == 0;
LAB_0010cf32:
  return (int)bVar5;
}

Assistant:

JX9_PRIVATE sxi32 jx9MemObjIsEmpty(jx9_value *pObj)
{
	if( pObj->iFlags & MEMOBJ_NULL ){
		return TRUE;
	}else if( pObj->iFlags & MEMOBJ_INT ){
		return pObj->x.iVal == 0 ? TRUE : FALSE;
	}else if( pObj->iFlags & MEMOBJ_REAL ){
		return pObj->x.rVal == (jx9_real)0 ? TRUE : FALSE;
	}else if( pObj->iFlags & MEMOBJ_BOOL ){
		return !pObj->x.iVal;
	}else if( pObj->iFlags & MEMOBJ_STRING ){
		if( SyBlobLength(&pObj->sBlob) <= 0 ){
			return TRUE;
		}else{
			const char *zIn, *zEnd;
			zIn = (const char *)SyBlobData(&pObj->sBlob);
			zEnd = &zIn[SyBlobLength(&pObj->sBlob)];
			while( zIn < zEnd ){
				if( zIn[0] != '0' ){
					break;
				}
				zIn++;
			}
			return zIn >= zEnd ? TRUE : FALSE;
		}
	}else if( pObj->iFlags & MEMOBJ_HASHMAP ){
		jx9_hashmap *pMap = (jx9_hashmap *)pObj->x.pOther;
		return pMap->nEntry == 0 ? TRUE : FALSE;
	}else if ( pObj->iFlags & (MEMOBJ_RES) ){
		return FALSE;
	}
	/* Assume empty by default */
	return TRUE;
}